

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

QVariant * __thiscall QVariantAnimation::currentValue(QVariantAnimation *this)

{
  bool bVar1;
  QVariant *in_RDI;
  QVariantAnimationPrivate *d;
  bool in_stack_00000067;
  QVariantAnimationPrivate *in_stack_00000068;
  QVariant *this_00;
  
  this_00 = in_RDI;
  d_func((QVariantAnimation *)0x68f3b8);
  bVar1 = ::QVariant::isValid(this_00);
  if (!bVar1) {
    QVariantAnimationPrivate::recalculateCurrentInterval(in_stack_00000068,in_stack_00000067);
  }
  ::QVariant::QVariant(this_00,in_RDI);
  return this_00;
}

Assistant:

QVariant QVariantAnimation::currentValue() const
{
    Q_D(const QVariantAnimation);
    if (!d->currentValue.isValid())
        const_cast<QVariantAnimationPrivate*>(d)->recalculateCurrentInterval();
    return d->currentValue;
}